

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O0

void __thiscall ON_XMLVariant::StringToPoint(ON_XMLVariant *this,int numValues)

{
  bool bVar1;
  int iVar2;
  double dVar3;
  int local_3c;
  int local_38;
  int i_1;
  int i;
  wchar_t *local_28;
  wchar_t *p;
  ON_wString s;
  bool good;
  int numValues_local;
  ON_XMLVariant *this_local;
  
  s.m_s._3_1_ = 1;
  s.m_s._4_4_ = numValues;
  if ((numValues < 0) || (0x10 < numValues)) {
    s.m_s._3_1_ = 0;
  }
  else {
    bVar1 = ON_wString::IsEmpty(&this->_private->_string_val);
    if (bVar1) {
      s.m_s._3_1_ = 0;
    }
  }
  if ((s.m_s._3_1_ & 1) == 0) {
    for (local_3c = 0; local_3c < 0x10; local_3c = local_3c + 1) {
      *(undefined8 *)((long)&this->_private->field_2 + (long)local_3c * 8) = 0;
    }
  }
  else {
    ON_wString::operator+((ON_wString *)&p,(wchar_t *)&this->_private->_string_val);
    local_28 = ON_wString::operator_cast_to_wchar_t_((ON_wString *)&p);
    for (local_38 = 0; local_38 < s.m_s._4_4_; local_38 = local_38 + 1) {
      while (iVar2 = iswspace(*local_28), iVar2 != 0) {
        local_28 = local_28 + 1;
      }
      iVar2 = isdigit(*local_28);
      if ((((iVar2 != 0) || (*local_28 == L'.')) || (*local_28 == L'+')) || (*local_28 == L'-')) {
        dVar3 = ON_wtof(local_28);
        *(double *)((long)&this->_private->field_2 + (long)local_38 * 8) = dVar3;
      }
      for (; *local_28 != L','; local_28 = local_28 + 1) {
      }
      ON_REMOVE_ASAP_AssertEx
                ((uint)(*local_28 == L','),
                 "/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_xml.cpp"
                 ,0x4fd,"","*p == L\',\' is false");
      local_28 = local_28 + 1;
    }
    ON_wString::~ON_wString((ON_wString *)&p);
  }
  return;
}

Assistant:

void ON_XMLVariant::StringToPoint(int numValues) const
{
  // 22nd September 2022 John Croudy, https://mcneel.myjetbrains.com/youtrack/issue/RH-77182
  // This function crashed on the Mac inside wcstod_l() which must be getting called from the call to
  // ON_wtof(). The only way that function can fail is if either the input pointers are invalid or the
  // input string or locale is corrupted. I don't have any control over the locale (I don't even know
  // how it's being accessed on the Mac), so all I can do is check the input string. It's unlikely that
  // an incorrectly formatted string (i.e., not a float) would cause a crash, but I can do some simple
  // validation to try and avoid trouble.

  bool good = true;

  if ((numValues < 0) || (numValues > _private->array_val_max))
  {
    good = false;
  }
  else
  if (_private->_string_val.IsEmpty())
  {
    good = false;
  }

  if (good)
  {
    ON_wString s = _private->_string_val + L",0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,";

    auto* p = static_cast<const wchar_t*>(s);
    for (int i = 0; i < numValues; i++)
    {
      // Skip white space. iswspace() returns 0 for the terminator so we can't go off the end of the buffer.
      while (0 != iswspace(*p))
      {
        p++;
      }

      // Quick and simple sanity check at the start of a float value.
      if (isdigit(*p) || (*p == '.') || (*p == '+') || (*p == '-'))
      {
        _private->_array_val[i] = ON_wtof(p);
      }

      // Because we've appended a fixed string containing commas, we know the pointer can't go off
      // the end of the buffer while checking for a comma.
      while (*p != L',')
      {
        p++;
      }

      // 'p' is now pointing to a comma.
      ON_ASSERT(*p == L',');

      // After incrementing it, the worst case scenario is that it's pointing to the terminator.
      p++;
    }
  }
  else
  {
    // Bad input; clear the result to all zeroes.
    for (int i = 0; i < _private->array_val_max; i++)
    {
      _private->_array_val[i] = 0.0;
    }
  }
}